

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v6::internal::fallback_format<long_double>(longdouble d,buffer<char> *buf,int *exp10)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  char *pcVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  bigint lower;
  bigint denominator;
  bigint numerator;
  bigint upper_store;
  bigint local_2d0;
  bigint local_228;
  bigint local_180;
  undefined **local_d8;
  undefined1 *local_d0;
  undefined8 uStack_c8;
  long local_c0;
  undefined1 local_b8 [128];
  undefined4 local_38;
  
  local_180.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001b7ca0;
  puVar1 = local_180.bigits_.store_;
  local_180.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_228.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_228.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001b7ca0;
  puVar2 = local_228.bigits_.store_;
  local_228.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_228.exp_ = 0;
  local_2d0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2d0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001b7ca0;
  puVar3 = local_2d0.bigits_.store_;
  local_2d0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2d0.exp_ = 0;
  uStack_c8 = 0;
  local_d8 = &PTR_grow_001b7ca0;
  local_c0 = 0x20;
  local_38 = 0;
  local_180.bigits_.store_[0] = 0;
  local_180.bigits_.super_buffer<unsigned_int>.size_ = 1;
  local_180.exp_ = 0;
  local_2d0.bigits_.super_buffer<unsigned_int>.ptr_ = puVar3;
  local_228.bigits_.super_buffer<unsigned_int>.ptr_ = puVar2;
  local_180.bigits_.super_buffer<unsigned_int>.ptr_ = puVar1;
  local_d0 = local_b8;
  bigint::operator<<=(&local_180,0);
  *local_2d0.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
  if (local_2d0.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
    (**local_2d0.bigits_.super_buffer<unsigned_int>._vptr_buffer)();
  }
  local_2d0.bigits_.super_buffer<unsigned_int>.size_ = 1;
  local_2d0.exp_ = 0;
  bigint::operator<<=(&local_2d0,0);
  bigint::assign_pow10(&local_228,*exp10);
  bigint::operator<<=(&local_228,1);
  pcVar4 = buf->ptr_;
  lVar10 = 0;
  while( true ) {
    uVar6 = bigint::divmod_assign(&local_180,&local_228);
    iVar7 = compare(&local_180,&local_2d0);
    iVar8 = add_compare(&local_180,&local_2d0,&local_228);
    pcVar4[lVar10] = (char)uVar6 + '0';
    if ((iVar7 < 1) || (-1 < iVar8)) break;
    bigint::multiply(&local_180,10);
    lVar10 = lVar10 + 1;
    bigint::multiply(&local_2d0,10);
  }
  if (iVar7 < 1) {
    if (iVar8 < 0) goto LAB_0017244c;
    iVar7 = add_compare(&local_180,&local_180,&local_228);
    if ((iVar7 < 1) && ((uVar6 & 1) == 0 || iVar7 != 0)) goto LAB_0017244c;
    cVar5 = pcVar4[lVar10] + '\x01';
  }
  else {
    cVar5 = (char)uVar6 + '1';
  }
  pcVar4[lVar10] = cVar5;
LAB_0017244c:
  uVar9 = lVar10 + 1U & 0xffffffff;
  if (buf->capacity_ < uVar9) {
    (**buf->_vptr_buffer)(buf,uVar9);
  }
  buf->size_ = uVar9;
  *exp10 = *exp10 - (int)lVar10;
  local_d8 = &PTR_grow_001b7ca0;
  if (local_d0 != local_b8) {
    operator_delete(local_d0,local_c0 << 2);
  }
  local_2d0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001b7ca0;
  if (local_2d0.bigits_.super_buffer<unsigned_int>.ptr_ != puVar3) {
    operator_delete(local_2d0.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_2d0.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  local_228.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001b7ca0;
  if (local_228.bigits_.super_buffer<unsigned_int>.ptr_ != puVar2) {
    operator_delete(local_228.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_228.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  local_180.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001b7ca0;
  if (local_180.bigits_.super_buffer<unsigned_int>.ptr_ != puVar1) {
    operator_delete(local_180.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_180.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  return;
}

Assistant:

void fallback_format(Double d, buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  // TODO: handle float
  int shift = value.assign(d) ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= 1;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  if (!upper) upper = &lower;
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  bool even = (value.f & 1) == 0;
  int num_digits = 0;
  char* data = buf.data();
  for (;;) {
    int digit = numerator.divmod_assign(denominator);
    bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
    // numerator + upper >[=] pow10:
    bool high = add_compare(numerator, *upper, denominator) + even > 0;
    data[num_digits++] = static_cast<char>('0' + digit);
    if (low || high) {
      if (!low) {
        ++data[num_digits - 1];
      } else if (high) {
        int result = add_compare(numerator, numerator, denominator);
        // Round half to even.
        if (result > 0 || (result == 0 && (digit % 2) != 0))
          ++data[num_digits - 1];
      }
      buf.resize(to_unsigned(num_digits));
      exp10 -= num_digits - 1;
      return;
    }
    numerator *= 10;
    lower *= 10;
    if (upper != &lower) *upper *= 10;
  }
}